

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

buffer __thiscall
anon_unknown.dwarf_146a0::MemoryFile::make_buffer(MemoryFile *this,size_t elements)

{
  _func_int **pp_Var1;
  GTestFlagSaver *pGVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer bVar3;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<unsigned_char_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_unittests_os_test_file_cpp:421:56),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_20;
  
  pp_Var1 = (_func_int **)operator_new__(elements);
  (this->super_Test)._vptr_Test = pp_Var1;
  (this->super_Test).gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  pGVar2 = (GTestFlagSaver *)operator_new(0x18);
  local_20._M_alloc = &__a2;
  (pGVar2->color_)._M_dataplus._M_p = (pointer)0x100000001;
  *(undefined ***)pGVar2 = &PTR___Sp_counted_base_001c9d00;
  (pGVar2->color_)._M_string_length = (size_type)pp_Var1;
  (this->super_Test).gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = pGVar2;
  local_20._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<unsigned_char_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp:421:56),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_20);
  bVar3.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  bVar3.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (buffer)bVar3.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static buffer make_buffer (std::size_t elements) {
            return buffer (new std::uint8_t[elements], [] (std::uint8_t * p) { delete[] p; });
        }